

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_transfer(Curl_multi *multi)

{
  CURLMsg *pCVar1;
  CURLMsg *msg;
  int local_20;
  int rc;
  int still_running;
  CURLcode result;
  CURLMcode mcode;
  _Bool done;
  Curl_multi *multi_local;
  
  result._3_1_ = CURLE_OK >> 0x18;
  still_running = 0;
  rc = 0;
  _mcode = multi;
  while ((result._3_1_ & 1) == CURLE_OK >> 0x18 && still_running == 0) {
    local_20 = 0;
    still_running = curl_multi_poll(_mcode,(curl_waitfd *)0x0,0,1000,(int *)0x0);
    if (still_running == CURLM_OK) {
      still_running = curl_multi_perform(_mcode,&local_20);
    }
    if (((still_running == 0) && (local_20 == 0)) &&
       (pCVar1 = curl_multi_info_read(_mcode,(int *)((long)&msg + 4)), pCVar1 != (CURLMsg *)0x0)) {
      rc = (pCVar1->data).result;
      result._3_1_ = 1;
    }
  }
  if ((still_running != 0) && (rc = 0x2b, still_running == 3)) {
    rc = 0x1b;
  }
  return rc;
}

Assistant:

static CURLcode easy_transfer(struct Curl_multi *multi)
{
  bool done = FALSE;
  CURLMcode mcode = CURLM_OK;
  CURLcode result = CURLE_OK;

  while(!done && !mcode) {
    int still_running = 0;

    mcode = curl_multi_poll(multi, NULL, 0, 1000, NULL);

    if(!mcode)
      mcode = curl_multi_perform(multi, &still_running);

    /* only read 'still_running' if curl_multi_perform() return OK */
    if(!mcode && !still_running) {
      int rc;
      CURLMsg *msg = curl_multi_info_read(multi, &rc);
      if(msg) {
        result = msg->data.result;
        done = TRUE;
      }
    }
  }

  /* Make sure to return some kind of error if there was a multi problem */
  if(mcode) {
    result = (mcode == CURLM_OUT_OF_MEMORY) ? CURLE_OUT_OF_MEMORY :
      /* The other multi errors should never happen, so return
         something suitably generic */
      CURLE_BAD_FUNCTION_ARGUMENT;
  }

  return result;
}